

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csprng.cpp
# Opt level: O3

void __thiscall jbcoin::csprng_engine::operator()(csprng_engine *this,void *ptr,size_t count)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  iVar1 = RAND_bytes((uchar *)ptr,(int)count);
  if (iVar1 == 1) {
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  Throw<std::runtime_error,char_const(&)[21]>((char (*) [21])"Insufficient entropy");
}

Assistant:

void
csprng_engine::operator()(void *ptr, std::size_t count)
{
    std::lock_guard<std::mutex> lock (mutex_);

    auto const result = RAND_bytes (
        reinterpret_cast<unsigned char*>(ptr),
        count);

    if (result != 1)
        Throw<std::runtime_error> ("Insufficient entropy");
}